

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

void __thiscall Socket_Write_Test::~Socket_Write_Test(Socket_Write_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Socket, Write) {
    constexpr uint16_t PORT = 27002;

    const char* data = "Hello, World\n";
    size_t length = strlen(data) + 1;

    ServerSocket server;
    server.bind("127.0.0.1", PORT);

    std::thread thread([&]() {
        try {
            auto handle = server.accept();
            handle.setSoLinger(false, 0);

            std::vector<char> buffer(length);
            size_t read = handle.read(buffer);
            while (read != length) read += handle.read(buffer);

            EXPECT_TRUE(strcmp(buffer.data(), data) == 0);
        } catch (const std::exception& ex) {
            FAIL() << ex.what() << '\n';
        }
    });

    {
        Socket socket;
        socket.setSoLinger(false, 0);
        socket.connect("127.0.0.1", PORT);
        socket.write(data, length);
    }

    thread.join();
}